

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instruction.cpp
# Opt level: O1

void __thiscall randomx::Instruction::h_IADD_RS(Instruction *this,ostream *os)

{
  byte bVar1;
  ostream *this_00;
  long *plVar2;
  uint uVar3;
  
  uVar3 = this->dst & 7;
  bVar1 = this->src;
  std::__ostream_insert<char,std::char_traits<char>>(os,"r",1);
  this_00 = (ostream *)std::ostream::operator<<(os,uVar3);
  std::__ostream_insert<char,std::char_traits<char>>(this_00,", r",3);
  std::ostream::operator<<(this_00,bVar1 & 7);
  if (uVar3 == 5) {
    std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
    std::ostream::operator<<(os,this->imm32);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,", SHFT ",7);
  plVar2 = (long *)std::ostream::operator<<(os,this->mod >> 2 & 3);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  return;
}

Assistant:

void Instruction::h_IADD_RS(std::ostream& os) const {
		auto dstIndex = dst % RegistersCount;
		auto srcIndex = src % RegistersCount;
		os << "r" << dstIndex << ", r" << srcIndex;
		if(dstIndex == RegisterNeedsDisplacement) {
			os << ", " << (int32_t)getImm32();
		}
		os << ", SHFT " << getModShift() << std::endl;
	}